

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cxx
# Opt level: O1

void __thiscall
trento::Event::compute_nuclear_thickness
          (Event *this,Nucleus *nucleus,NucleonCommon *nucleon_common,Grid *TX)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  size_type sVar4;
  pointer pNVar5;
  pointer pCVar6;
  long lVar7;
  double *pdVar8;
  long lVar9;
  long lVar10;
  undefined1 auVar11 [16];
  int iVar12;
  pointer pCVar13;
  pointer pNVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  pointer pCVar18;
  const_iterator __end1;
  int iVar19;
  long lVar20;
  int iVar21;
  double *pdVar22;
  long lVar23;
  long lVar24;
  double dVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  double dVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  double dVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [64];
  undefined1 auVar37 [16];
  double dVar38;
  undefined1 auVar39 [16];
  undefined1 auVar41 [64];
  undefined1 auVar42 [16];
  double dVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined8 in_XMM14_Qa;
  undefined8 in_XMM14_Qb;
  NucleonData *nucleon;
  undefined1 auVar33 [64];
  undefined1 auVar40 [64];
  
  sVar4 = (TX->super_multi_array_ref<double,_2UL>).
          super_const_multi_array_ref<double,_2UL,_double_*>.num_elements_;
  if (sVar4 != 0) {
    memset((TX->super_multi_array_ref<double,_2UL>).
           super_const_multi_array_ref<double,_2UL,_double_*>.base_ +
           (TX->super_multi_array_ref<double,_2UL>).
           super_const_multi_array_ref<double,_2UL,_double_*>.origin_offset_,0,sVar4 << 3);
  }
  pNVar5 = (nucleus->nucleons_).
           super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pNVar14 = (nucleus->nucleons_).
                 super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>.
                 _M_impl.super__Vector_impl_data._M_start; pNVar14 != pNVar5; pNVar14 = pNVar14 + 1)
  {
    if (pNVar14->is_participant_ == true) {
      this->npart_ = this->npart_ + 1;
      pCVar13 = (pNVar14->constituents_).
                super__Vector_base<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pCVar6 = (pNVar14->constituents_).
               super__Vector_base<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      dVar43 = pCVar13->x;
      auVar39._8_8_ = 0;
      auVar39._0_8_ = dVar43;
      auVar40 = ZEXT1664(auVar39);
      dVar30 = pCVar13->y;
      auVar31._8_8_ = 0;
      auVar31._0_8_ = dVar30;
      auVar33 = ZEXT1664(auVar31);
      pCVar13 = pCVar13 + 1;
      dVar34 = dVar30;
      dVar38 = dVar43;
      if (pCVar13 != pCVar6) {
        auVar41 = ZEXT1664(auVar39);
        auVar36 = ZEXT1664(auVar31);
        do {
          dVar43 = pCVar13->x;
          auVar26._8_8_ = 0;
          auVar26._0_8_ = dVar43;
          if (auVar40._0_8_ <= dVar43) {
            if (auVar41._0_8_ < dVar43) {
              auVar41 = ZEXT1664(auVar26);
            }
          }
          else {
            auVar40 = ZEXT1664(auVar26);
          }
          dVar38 = auVar40._0_8_;
          dVar43 = auVar41._0_8_;
          dVar30 = pCVar13->y;
          auVar27._8_8_ = 0;
          auVar27._0_8_ = dVar30;
          if (auVar33._0_8_ <= dVar30) {
            if (auVar36._0_8_ < dVar30) {
              auVar36 = ZEXT1664(auVar27);
            }
          }
          else {
            auVar33 = ZEXT1664(auVar27);
          }
          dVar34 = auVar36._0_8_;
          dVar30 = auVar33._0_8_;
          pCVar13 = pCVar13 + 1;
        } while (pCVar13 != pCVar6);
      }
      dVar25 = nucleon_common->constituent_radius_sq_;
      auVar28._8_8_ = 0;
      auVar28._0_8_ = dVar25;
      if (dVar25 < 0.0) {
        dVar25 = sqrt(dVar25);
      }
      else {
        auVar31 = vsqrtsd_avx(auVar28,auVar28);
        dVar25 = auVar31._0_8_;
      }
      dVar1 = this->xymax_;
      dVar2 = this->dxy_;
      iVar12 = this->nsteps_ + -1;
      iVar15 = (int)(((dVar30 - dVar25) + dVar1) / dVar2);
      iVar21 = iVar15;
      if (iVar12 < iVar15) {
        iVar21 = iVar12;
      }
      if (iVar15 < 0) {
        iVar21 = 0;
      }
      iVar16 = (int)((dVar34 + dVar25 + dVar1) / dVar2);
      iVar15 = iVar16;
      if (iVar12 < iVar16) {
        iVar15 = iVar12;
      }
      if (iVar16 < 0) {
        iVar15 = 0;
      }
      if (iVar21 <= iVar15) {
        iVar19 = (int)((dVar43 + dVar25 + dVar1) / dVar2);
        iVar16 = iVar19;
        if (iVar12 < iVar19) {
          iVar16 = iVar12;
        }
        if (iVar19 < 0) {
          iVar16 = 0;
        }
        iVar19 = (int)(((dVar38 - dVar25) + dVar1) / dVar2);
        if (iVar19 <= iVar12) {
          iVar12 = iVar19;
        }
        if (iVar19 < 0) {
          iVar12 = 0;
        }
        lVar7 = (TX->super_multi_array_ref<double,_2UL>).
                super_const_multi_array_ref<double,_2UL,_double_*>.origin_offset_;
        pdVar8 = (TX->super_multi_array_ref<double,_2UL>).
                 super_const_multi_array_ref<double,_2UL,_double_*>.base_;
        lVar9 = (TX->super_multi_array_ref<double,_2UL>).
                super_const_multi_array_ref<double,_2UL,_double_*>.stride_list_.elems[0];
        lVar10 = (TX->super_multi_array_ref<double,_2UL>).
                 super_const_multi_array_ref<double,_2UL,_double_*>.stride_list_.elems[1];
        lVar24 = (long)iVar21;
        do {
          if (iVar12 <= iVar16) {
            pCVar13 = (pNVar14->constituents_).
                      super__Vector_base<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pCVar6 = (pNVar14->constituents_).
                     super__Vector_base<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            lVar20 = lVar9 * lVar24;
            lVar23 = (long)iVar12;
            do {
              if (pCVar13 == pCVar6) {
                dVar43 = 0.0;
              }
              else {
                auVar35._8_8_ = 0;
                auVar35._0_8_ = this->dxy_;
                auVar37._8_8_ = 0;
                auVar37._0_8_ = this->xymax_;
                auVar32._8_8_ = 0;
                auVar32._0_8_ = (double)(int)lVar23 + 0.5;
                auVar31 = vfmsub213sd_fma(auVar32,auVar35,auVar37);
                auVar29._8_8_ = 0;
                auVar29._0_8_ = (double)(int)lVar24 + 0.5;
                auVar39 = vfmsub213sd_fma(auVar35,auVar29,auVar37);
                dVar30 = (nucleon_common->fast_exp_).xmin_;
                dVar34 = (nucleon_common->fast_exp_).dx_;
                auVar42._8_8_ = 0;
                auVar42._0_8_ = dVar34;
                auVar33 = ZEXT1664(ZEXT816(0));
                pdVar22 = &pCVar13->fluctuation;
                do {
                  dVar43 = auVar31._0_8_ - ((Constituent *)(pdVar22 + -2))->x;
                  dVar38 = auVar39._0_8_ - pdVar22[-1];
                  dVar43 = dVar43 * dVar43 + dVar38 * dVar38;
                  if (dVar43 < nucleon_common->constituent_radius_sq_) {
                    dVar43 = (dVar43 * -0.5) / nucleon_common->constituent_width_sq_;
                    auVar46._8_8_ = 0;
                    auVar46._0_8_ = (dVar43 - dVar30) / dVar34 + 0.5;
                    lVar17 = vcvttsd2usi_avx512f(auVar46);
                    auVar11._8_8_ = in_XMM14_Qb;
                    auVar11._0_8_ = in_XMM14_Qa;
                    auVar26 = vcvtusi2sd_avx512f(auVar11,lVar17);
                    auVar44._8_8_ = 0;
                    auVar44._0_8_ = (dVar43 + 1.0) - dVar30;
                    auVar26 = vfnmadd213sd_fma(auVar26,auVar42,auVar44);
                    auVar3._8_8_ = 0;
                    auVar3._0_8_ = *pdVar22;
                    auVar45._8_8_ = 0;
                    auVar45._0_8_ =
                         auVar26._0_8_ *
                         (nucleon_common->fast_exp_).table_.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar17];
                    auVar26 = vfmadd231sd_fma(auVar33._0_16_,auVar45,auVar3);
                    auVar33 = ZEXT1664(auVar26);
                  }
                  dVar43 = auVar33._0_8_;
                  pCVar18 = (pointer)(pdVar22 + 1);
                  pdVar22 = pdVar22 + 3;
                } while (pCVar18 != pCVar6);
              }
              lVar17 = lVar10 * lVar23;
              pdVar8[lVar7 + lVar20 + lVar17] =
                   dVar43 * nucleon_common->prefactor_ + pdVar8[lVar7 + lVar20 + lVar17];
              lVar23 = lVar23 + 1;
            } while (iVar16 + 1 != (int)lVar23);
          }
          lVar24 = lVar24 + 1;
        } while (iVar15 + 1 != (int)lVar24);
      }
    }
  }
  return;
}

Assistant:

void Event::compute_nuclear_thickness(
    const Nucleus& nucleus, const NucleonCommon& nucleon_common, Grid& TX) {
  // Construct the thickness grid by looping over participants and adding each
  // to a small subgrid within its radius.  Compared to the other possibility
  // (grid cells as the outer loop and participants as the inner loop), this
  // reduces the number of required distance-squared calculations by a factor of
  // ~20 (depending on the nucleon size).  The Event unit test verifies that the
  // two methods agree.

  // Wipe grid with zeros.
  std::fill(TX.origin(), TX.origin() + TX.num_elements(), 0.);

  // Deposit each participant onto the grid.
  for (const auto& nucleon : nucleus) {
    if (!nucleon.is_participant())
      continue;

    ++npart_;

    // Get nucleon subgrid boundary {xmin, xmax, ymin, ymax}.
    const auto boundary = nucleon_common.boundary(nucleon);

    // Determine min & max indices of nucleon subgrid.
    int ixmin = clip(static_cast<int>((boundary[0]+xymax_)/dxy_), 0, nsteps_-1);
    int ixmax = clip(static_cast<int>((boundary[1]+xymax_)/dxy_), 0, nsteps_-1);
    int iymin = clip(static_cast<int>((boundary[2]+xymax_)/dxy_), 0, nsteps_-1);
    int iymax = clip(static_cast<int>((boundary[3]+xymax_)/dxy_), 0, nsteps_-1);

    // Add profile to grid.
    for (auto iy = iymin; iy <= iymax; ++iy) {
      for (auto ix = ixmin; ix <= ixmax; ++ix) {
        TX[iy][ix] += nucleon_common.thickness(
          nucleon, (ix+.5)*dxy_ - xymax_, (iy+.5)*dxy_ - xymax_
        );
      }
    }
  }
}